

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

bool __thiscall S2CellUnion::IsNormalized(S2CellUnion *this)

{
  pointer pSVar1;
  S2CellId d;
  S2CellId c;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  pSVar1 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(this->cell_ids_).
                              super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pSVar1) >> 3);
  if (0 < iVar3) {
    uVar4 = pSVar1->id_;
    if (0xbfffffffffffffff < uVar4) {
      return false;
    }
    if ((-uVar4 & uVar4 & 0x1555555555555555) == 0) {
      return false;
    }
  }
  lVar5 = (long)iVar3;
  uVar4 = 1;
  while (((((long)uVar4 < lVar5 && (d.id_ = pSVar1[uVar4].id_, d.id_ < 0xc000000000000000)) &&
          ((d.id_ & 0x1555555555555555 & -d.id_) != 0)) &&
         (c.id_ = pSVar1[uVar4 - 1].id_, (c.id_ - 1 | c.id_) < d.id_ - (~d.id_ & d.id_ - 1)))) {
    if ((2 < uVar4) &&
       (bVar2 = AreSiblings((S2CellId)pSVar1[uVar4 - 3].id_,(S2CellId)pSVar1[uVar4 - 2].id_,c,d),
       bVar2)) {
      return lVar5 <= (long)uVar4;
    }
    uVar4 = uVar4 + 1;
  }
  return lVar5 <= (long)uVar4;
}

Assistant:

bool S2CellUnion::IsNormalized() const {
  if (num_cells() > 0 && !cell_id(0).is_valid()) return false;
  for (int i = 1; i < num_cells(); ++i) {
    if (!cell_id(i).is_valid()) return false;
    if (cell_id(i - 1).range_max() >= cell_id(i).range_min()) return false;
    if (i >= 3 && AreSiblings(cell_id(i - 3), cell_id(i - 2),
                              cell_id(i - 1), cell_id(i))) {
      return false;
    }
  }
  return true;
}